

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::TrackSlotArrayPropertyForDebugger
          (ByteCodeGenerator *this,DebuggerScope *debuggerScope,Symbol *symbol,PropertyId propertyId
          ,DebuggerScopePropertyFlags flags,bool isFunctionDeclaration)

{
  RegSlot location;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (debuggerScope == (DebuggerScope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x18b,"(debuggerScope)","debuggerScope");
    if (!bVar2) goto LAB_00756089;
    *puVar3 = 0;
  }
  if (symbol == (Symbol *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x18c,"(symbol)","symbol");
    if (!bVar2) goto LAB_00756089;
    *puVar3 = 0;
  }
  if ((symbol->field_0x43 & 0x20) == 0) {
    location = symbol->scopeSlot;
    if (location == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x191,"(location != Js::Constants::NoRegister)",
                         "location != Js::Constants::NoRegister");
      if (!bVar2) goto LAB_00756089;
      *puVar3 = 0;
    }
    if (propertyId == -1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x192,"(propertyId != Js::Constants::NoProperty)",
                         "propertyId != Js::Constants::NoProperty");
      if (!bVar2) {
LAB_00756089:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    Js::ByteCodeWriter::AddPropertyToDebuggerScope
              (&this->m_writer,debuggerScope,location,propertyId,false,flags,isFunctionDeclaration);
    symbol->field_0x43 = symbol->field_0x43 | 0x20;
  }
  return;
}

Assistant:

void ByteCodeGenerator::TrackSlotArrayPropertyForDebugger(
    Js::DebuggerScope *debuggerScope,
    Symbol* symbol,
    Js::PropertyId propertyId,
    Js::DebuggerScopePropertyFlags flags /*= Js::DebuggerScopePropertyFlags_None*/,
    bool isFunctionDeclaration /*= false*/)
{
    // Note: Slot array properties are tracked even in non-debug mode in order to support slot array serialization
    // of let/const variables between non-debug and debug mode (for example, when a slot array var escapes and is retrieved
    // after a debugger attach or for WWA apps).  They are also needed for heap enumeration.
    Assert(debuggerScope);
    Assert(symbol);

    if (!symbol->GetIsTrackedForDebugger())
    {
        Js::RegSlot location = symbol->GetScopeSlot();
        Assert(location != Js::Constants::NoRegister);
        Assert(propertyId != Js::Constants::NoProperty);

        this->Writer()->AddPropertyToDebuggerScope(
            debuggerScope,
            location,
            propertyId,
            /*shouldConsumeRegister*/ false,
            flags,
            isFunctionDeclaration);

        symbol->SetIsTrackedForDebugger(true);
    }
}